

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall
cmFileCommand::HandleGlobCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool recurse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  PolicyStatus PVar7;
  int iVar8;
  undefined8 uVar9;
  char *pcVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  pointer pbVar14;
  size_type *psVar15;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  undefined7 in_register_00000011;
  byte bVar16;
  string *inexpr;
  pointer pMVar17;
  pointer pMVar18;
  ulong uVar19;
  long lVar20;
  string *__rhs;
  string expr;
  GlobMessages globMessages;
  string output;
  string variable;
  Glob g;
  string local_170;
  cmCommand *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  ulong local_108;
  uint local_100;
  uint local_fc;
  GlobMessages local_f8;
  long *local_d8 [2];
  long local_c8 [2];
  string local_b8;
  ulong local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  Glob local_88;
  
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_150 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14) < 0x21) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmFileCommand.cxx"
                  ,0x37c,
                  "bool cmFileCommand::HandleGlobCommand(const std::vector<std::string> &, bool)");
  }
  uVar19 = CONCAT71(in_register_00000011,recurse) & 0xffffffff;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  pcVar2 = pbVar14[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + pbVar14[1]._M_string_length);
  cmsys::Glob::Glob(&local_88);
  bVar16 = (byte)uVar19;
  local_88.Recurse = (bool)bVar16;
  PVar7 = cmMakefile::GetPolicyStatus(local_150->Makefile,CMP0009);
  local_98 = (ulong)PVar7;
  if ((PVar7 < (REQUIRED_ALWAYS|WARN) & bVar16) != 0) {
    local_88.RecurseThroughSymlinks = SUB81(0x101L >> ((char)PVar7 * '\b' & 0x3fU),0);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
  __rhs = pbVar14 + 2;
  if (__rhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    local_108 = 0;
    id = extraout_EDX;
  }
  else {
    paVar1 = &local_148.field_2;
    bVar4 = true;
    local_108 = 0;
    local_100 = (uint)CONCAT71(in_register_00000011,recurse);
    local_90 = args;
    do {
      pvVar13 = local_90;
      iVar8 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar8 == 0) {
        pbVar14 = __rhs + 1;
        if (pbVar14 !=
            (pvVar13->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          bVar5 = cmSystemTools::IsOn((pbVar14->_M_dataplus)._M_p);
          bVar6 = true;
          if (!bVar5) {
            bVar6 = cmSystemTools::IsOff((pbVar14->_M_dataplus)._M_p);
            if (!bVar6) {
              local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_170,"LIST_DIRECTORIES missing bool value.","");
              cmCommand::SetError(local_150,&local_170);
              goto LAB_003af189;
            }
            bVar6 = false;
          }
          local_88.ListDirs = bVar6;
          __rhs = __rhs + 2;
          local_88.RecurseListDirs = local_88.ListDirs;
          goto LAB_003aeb36;
        }
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,"LIST_DIRECTORIES missing bool value.","");
        cmCommand::SetError(local_150,&local_170);
LAB_003af189:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
LAB_003af1a5:
        bVar4 = false;
        goto LAB_003af1a7;
      }
LAB_003aeb36:
      if (((char)uVar19 != '\0') &&
         (uVar9 = std::__cxx11::string::compare((char *)__rhs), (int)uVar9 == 0)) {
        local_88.RecurseThroughSymlinks = true;
        __rhs = __rhs + 1;
        local_108 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
        if (__rhs == (pvVar13->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,
                     "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS","");
          cmCommand::SetError(local_150,&local_170);
          goto LAB_003af189;
        }
      }
      iVar8 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar8 == 0) {
        if (__rhs + 1 ==
            (pvVar13->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"GLOB requires a directory after the RELATIVE tag","");
          cmCommand::SetError(local_150,&local_170);
        }
        else {
          cmsys::Glob::SetRelative(&local_88,__rhs[1]._M_dataplus._M_p);
          __rhs = __rhs + 2;
          if (__rhs != (pvVar13->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish) goto LAB_003aebb2;
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"GLOB requires a glob expression after the directory","");
          cmCommand::SetError(local_150,&local_170);
        }
        goto LAB_003af189;
      }
LAB_003aebb2:
      local_f8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar6 = cmsys::SystemTools::FileIsFullPath((__rhs->_M_dataplus)._M_p);
      if (bVar6) {
        cmsys::Glob::FindFiles(&local_88,__rhs,&local_f8);
      }
      else {
        pcVar10 = cmMakefile::GetCurrentSourceDirectory(local_150->Makefile);
        std::__cxx11::string::string((string *)&local_170,pcVar10,(allocator *)&local_148);
        inexpr = __rhs;
        if (local_170._M_string_length != 0) {
          std::operator+(&local_148,"/",__rhs);
          std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_148._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar1) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          inexpr = &local_170;
        }
        cmsys::Glob::FindFiles(&local_88,inexpr,&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_f8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_f8.super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        uVar9 = 0;
        pMVar17 = local_f8.
                  super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          local_fc = (uint)uVar9;
          pMVar18 = pMVar17;
          while( true ) {
            pMVar17 = pMVar18 + 1;
            pcVar3 = local_150->Makefile;
            if (pMVar18->type != cyclicRecursion) break;
            std::operator+(&local_128,"Cyclic recursion detected while globbing for \'",__rhs);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_128);
            psVar15 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_148.field_2._M_allocated_capacity = *psVar15;
              local_148.field_2._8_8_ = plVar11[3];
              local_148._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_148.field_2._M_allocated_capacity = *psVar15;
              local_148._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_148._M_string_length = plVar11[1];
            *plVar11 = (long)psVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_148,
                                         (ulong)(pMVar18->content)._M_dataplus._M_p);
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            psVar15 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) {
              local_170.field_2._M_allocated_capacity = *psVar15;
              local_170.field_2._8_8_ = plVar11[3];
            }
            else {
              local_170.field_2._M_allocated_capacity = *psVar15;
              local_170._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_170._M_string_length = plVar11[1];
            *plVar11 = (long)psVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_170,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            pMVar18 = pMVar17;
            if (pMVar17 ==
                local_f8.
                super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              if ((local_fc & 1) != 0) goto LAB_003af07e;
              goto LAB_003aef49;
            }
          }
          std::operator+(&local_128,"Error has occured while globbing for \'",__rhs);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_128);
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_148.field_2._M_allocated_capacity = *psVar15;
            local_148.field_2._8_8_ = plVar11[3];
            local_148._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_148.field_2._M_allocated_capacity = *psVar15;
            local_148._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_148._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_148,(ulong)(pMVar18->content)._M_dataplus._M_p
                                      );
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          psVar15 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) {
            local_170.field_2._M_allocated_capacity = *psVar15;
            local_170.field_2._8_8_ = plVar11[3];
          }
          else {
            local_170.field_2._M_allocated_capacity = *psVar15;
            local_170._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_170._M_string_length = plVar11[1];
          *plVar11 = (long)psVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          cmMakefile::IssueMessage(pcVar3,FATAL_ERROR,&local_170,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar1) {
            operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
          }
          paVar12 = &local_128.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar12) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
            paVar12 = extraout_RAX;
          }
          uVar9 = CONCAT71((int7)((ulong)paVar12 >> 8),1);
        } while (pMVar17 !=
                 local_f8.
                 super__Vector_base<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
LAB_003af07e:
        std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector(&local_f8)
        ;
        goto LAB_003af1a5;
      }
LAB_003aef49:
      pvVar13 = cmsys::Glob::GetFiles_abi_cxx11_(&local_88);
      pbVar14 = (pvVar13->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar13->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pbVar14) {
        lVar20 = 8;
        uVar19 = 0;
        do {
          if (!bVar4) {
            std::__cxx11::string::append((char *)local_d8);
            pbVar14 = (pvVar13->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          std::__cxx11::string::_M_append((char *)local_d8,*(ulong *)((long)pbVar14 + lVar20 + -8));
          uVar19 = uVar19 + 1;
          pbVar14 = (pvVar13->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar20 = lVar20 + 0x20;
          bVar4 = false;
        } while (uVar19 < (ulong)((long)(pvVar13->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14
                                 >> 5));
      }
      std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::~vector(&local_f8);
      __rhs = __rhs + 1;
      uVar19 = (ulong)local_100;
      bVar16 = (byte)local_100;
      id = extraout_EDX_00;
    } while (__rhs != (local_90->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
  }
  if (((bVar16 != 0) && ((uint)local_98 < 2 && (local_108 & 1) == 0)) &&
     (local_88.FollowedSymlinkCount != 0)) {
    pcVar3 = local_150->Makefile;
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_170,(cmPolicies *)0x9,id);
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&local_170,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = true;
  cmMakefile::AddDefinition(local_150->Makefile,&local_b8,(char *)local_d8[0]);
LAB_003af1a7:
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  cmsys::Glob::~Glob(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool cmFileCommand::HandleGlobCommand(std::vector<std::string> const& args,
  bool recurse)
{
  // File commands has at least one argument
  assert(args.size() > 1);

  std::vector<std::string>::const_iterator i = args.begin();

  i++; // Get rid of subcommand

  std::string variable = *i;
  i++;
  cmsys::Glob g;
  g.SetRecurse(recurse);

  bool explicitFollowSymlinks = false;
  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0009);
  if(recurse)
    {
    switch(status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        g.RecurseThroughSymlinksOff();
        break;
      case cmPolicies::OLD:
      case cmPolicies::WARN:
        g.RecurseThroughSymlinksOn();
        break;
      }
    }

  std::string output = "";
  bool first = true;
  for ( ; i != args.end(); ++i )
    {
    if( *i == "LIST_DIRECTORIES" )
      {
      ++i;
      if(i != args.end())
        {
        if(cmSystemTools::IsOn(i->c_str()))
          {
          g.SetListDirs(true);
          g.SetRecurseListDirs(true);
          }
        else if(cmSystemTools::IsOff(i->c_str()))
          {
          g.SetListDirs(false);
          g.SetRecurseListDirs(false);
          }
        else
          {
          this->SetError("LIST_DIRECTORIES missing bool value.");
          return false;
          }
        }
      else
        {
        this->SetError("LIST_DIRECTORIES missing bool value.");
        return false;
        }
      ++i;
      }

    if ( recurse && (*i == "FOLLOW_SYMLINKS") )
      {
      explicitFollowSymlinks = true;
      g.RecurseThroughSymlinksOn();
      ++i;
      if ( i == args.end() )
        {
        this->SetError(
          "GLOB_RECURSE requires a glob expression after FOLLOW_SYMLINKS");
        return false;
        }
      }

    if ( *i == "RELATIVE" )
      {
      ++i; // skip RELATIVE
      if ( i == args.end() )
        {
        this->SetError("GLOB requires a directory after the RELATIVE tag");
        return false;
        }
      g.SetRelative(i->c_str());
      ++i;
      if(i == args.end())
        {
        this->SetError("GLOB requires a glob expression after the directory");
        return false;
        }
      }

    cmsys::Glob::GlobMessages globMessages;
    if ( !cmsys::SystemTools::FileIsFullPath(i->c_str()) )
      {
      std::string expr = this->Makefile->GetCurrentSourceDirectory();
      // Handle script mode
      if (!expr.empty())
        {
        expr += "/" + *i;
        g.FindFiles(expr, &globMessages);
        }
      else
        {
        g.FindFiles(*i, &globMessages);
        }
      }
    else
      {
      g.FindFiles(*i, &globMessages);
      }

    if(!globMessages.empty())
      {
      bool shouldExit = false;
      for(cmsys::Glob::GlobMessagesIterator it=globMessages.begin();
        it != globMessages.end(); ++it)
        {
        if(it->type == cmsys::Glob::cyclicRecursion)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            "Cyclic recursion detected while globbing for '"
            + *i + "':\n" + it->content);
          }
        else
          {
          this->Makefile->IssueMessage(cmake::FATAL_ERROR,
            "Error has occured while globbing for '"
            + *i + "' - " + it->content);
          shouldExit = true;
          }
        }
      if(shouldExit)
        {
          return false;
        }
      }

    std::vector<std::string>::size_type cc;
    std::vector<std::string>& files = g.GetFiles();
    for ( cc = 0; cc < files.size(); cc ++ )
      {
      if ( !first )
        {
        output += ";";
        }
      output += files[cc];
      first = false;
      }
    }

  if(recurse && !explicitFollowSymlinks)
    {
    switch (status)
      {
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Correct behavior, yay!
        break;
      case cmPolicies::OLD:
        // Probably not really the expected behavior, but the author explicitly
        // asked for the old behavior... no warning.
      case cmPolicies::WARN:
        // Possibly unexpected old behavior *and* we actually traversed
        // symlinks without being explicitly asked to: warn the author.
        if(g.GetFollowedSymlinkCount() != 0)
          {
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
            cmPolicies::GetPolicyWarning(cmPolicies::CMP0009));
          }
        break;
      }
    }

  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}